

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

UnaryOperator slang::ast::Expression::getUnaryOperator(SyntaxKind kind)

{
  UnaryOperator UVar1;
  logic_error *this;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(kind) {
  case UnaryBitwiseAndExpression:
    UVar1 = BitwiseAnd;
    break;
  case UnaryBitwiseNandExpression:
    UVar1 = BitwiseNand;
    break;
  case UnaryBitwiseNorExpression:
    UVar1 = BitwiseNor;
    break;
  case UnaryBitwiseNotExpression:
    UVar1 = BitwiseNot;
    break;
  case UnaryBitwiseOrExpression:
    UVar1 = BitwiseOr;
    break;
  case UnaryBitwiseXnorExpression:
    UVar1 = BitwiseXnor;
    break;
  case UnaryBitwiseXorExpression:
    UVar1 = BitwiseXor;
    break;
  case UnaryLogicalNotExpression:
    UVar1 = LogicalNot;
    break;
  case UnaryMinusExpression:
    UVar1 = Minus;
    break;
  case UnaryPlusExpression:
    UVar1 = Plus;
    break;
  case UnaryPredecrementExpression:
    UVar1 = Predecrement;
    break;
  case UnaryPreincrementExpression:
    UVar1 = Preincrement;
    break;
  default:
    if (kind == PostdecrementExpression) {
      UVar1 = Postdecrement;
    }
    else {
      if (kind != PostincrementExpression) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
                   ,"");
        plVar2 = (long *)std::__cxx11::string::append((char *)local_d0);
        local_b0._M_dataplus._M_p = (pointer)*plVar2;
        psVar3 = (size_type *)(plVar2 + 2);
        if ((size_type *)local_b0._M_dataplus._M_p == psVar3) {
          local_b0.field_2._M_allocated_capacity = *psVar3;
          local_b0.field_2._8_8_ = plVar2[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar3;
        }
        local_b0._M_string_length = plVar2[1];
        *plVar2 = (long)psVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::to_string(&local_70,0x7bc);
        std::operator+(&local_50,&local_b0,&local_70);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_90 = (long *)*plVar2;
        plVar4 = plVar2 + 2;
        if (local_90 == plVar4) {
          local_80 = *plVar4;
          lStack_78 = plVar2[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar4;
        }
        local_88 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_f0 = (long *)*plVar2;
        plVar4 = plVar2 + 2;
        if (local_f0 == plVar4) {
          local_e0 = *plVar4;
          lStack_d8 = plVar2[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar4;
        }
        local_e8 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::logic_error::logic_error(this,(string *)&local_f0);
        __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      UVar1 = Postincrement;
    }
  }
  return UVar1;
}

Assistant:

UnaryOperator Expression::getUnaryOperator(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::UnaryPlusExpression:
            return UnaryOperator::Plus;
        case SyntaxKind::UnaryMinusExpression:
            return UnaryOperator::Minus;
        case SyntaxKind::UnaryBitwiseNotExpression:
            return UnaryOperator::BitwiseNot;
        case SyntaxKind::UnaryBitwiseAndExpression:
            return UnaryOperator::BitwiseAnd;
        case SyntaxKind::UnaryBitwiseOrExpression:
            return UnaryOperator::BitwiseOr;
        case SyntaxKind::UnaryBitwiseXorExpression:
            return UnaryOperator::BitwiseXor;
        case SyntaxKind::UnaryBitwiseNandExpression:
            return UnaryOperator::BitwiseNand;
        case SyntaxKind::UnaryBitwiseNorExpression:
            return UnaryOperator::BitwiseNor;
        case SyntaxKind::UnaryBitwiseXnorExpression:
            return UnaryOperator::BitwiseXnor;
        case SyntaxKind::UnaryLogicalNotExpression:
            return UnaryOperator::LogicalNot;
        case SyntaxKind::UnaryPreincrementExpression:
            return UnaryOperator::Preincrement;
        case SyntaxKind::UnaryPredecrementExpression:
            return UnaryOperator::Predecrement;
        case SyntaxKind::PostincrementExpression:
            return UnaryOperator::Postincrement;
        case SyntaxKind::PostdecrementExpression:
            return UnaryOperator::Postdecrement;
        default:
            ASSUME_UNREACHABLE;
    }
}